

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O1

void __thiscall DifferentialEquation::prepareNextState(DifferentialEquation *this)

{
  byte bVar1;
  bool bVar2;
  code *pcVar3;
  long lVar4;
  
  if (0 < this->eqnTermAmount) {
    bVar1 = 1;
    lVar4 = 0;
    do {
      if ((bVar1 & 1) == 0) {
        bVar1 = 0;
      }
      else {
        bVar1 = (**(code **)((long)((this->eqnIntegrators).
                                    super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar4]->
                                   super_StochasticProcess).super_Parametric._vptr_Parametric + 0x30
                            ))();
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->eqnTermAmount);
    if (bVar1 == 0) {
      bVar2 = false;
      goto LAB_00127968;
    }
  }
  pcVar3 = (code *)this->eqnMethodPtr;
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *(long *)((long)&(this->super_StochasticVariable).
                                                  super_StochasticProcess.super_Parametric.
                                                  _vptr_Parametric + *(long *)&this->field_0x158) +
                                 -1);
  }
  (*pcVar3)();
  bVar2 = true;
LAB_00127968:
  (this->super_StochasticVariable).super_StochasticProcess.stochNextStateIsPrepared = bVar2;
  return;
}

Assistant:

void DifferentialEquation::prepareNextState()
{
	bool allStatesPrepared = true;
	for (int i=0; i<eqnTermAmount; ++i)
		allStatesPrepared = allStatesPrepared && (*eqnIntegrators[i]).isNextStatePrepared();
	
	if (allStatesPrepared) {
		(this->*eqnMethodPtr)();
		stochNextStateIsPrepared = true;
	}
	else
		stochNextStateIsPrepared = false;
}